

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

void dumpsymboltable(void)

{
  int local_10;
  uint local_c;
  int j;
  int i;
  
  printf("SYMBOL TABLE DUMP\n-----------------\n\n");
  printf("                   Token       Symbol     Data");
  printf("              Owning\n");
  printf("Index   Name       Class       Type       Type");
  printf("    Value   Procedure    Label\n");
  printf("-----   ----       -----       ------     ----");
  printf("    -----   ---------\n");
  for (local_c = 0; (int)local_c < symtablen; local_c = local_c + 1) {
    printf("%5d\t",(ulong)local_c);
    printlexeme(local_c);
    if (nametable[symtab[(int)local_c].thisname].strlength < 0xb) {
      for (local_10 = 0; local_10 < 0xb - nametable[symtab[(int)local_c].thisname].strlength;
          local_10 = local_10 + 1) {
        putchar(0x20);
      }
    }
    else {
      printf("\n          ");
    }
    printf("%s  ",tokclstring[symtab[(int)local_c].tok_class]);
    printf("%s  ",symtypestring[symtab[(int)local_c].symtype]);
    printf("%s",datatypestring[symtab[(int)local_c].dataclass]);
    if (symtab[(int)local_c].value.tag == tint) {
      printf(" %5d",(ulong)(uint)symtab[(int)local_c].value.val.ival);
    }
    else {
      printf(" %8.3f",(double)symtab[(int)local_c].value.val.rval);
    }
    if (symtab[(int)local_c].owningprocedure == -1) {
      printf("   global");
    }
    else {
      printf("   ");
      LexemeInCaps(symtab[(int)local_c].owningprocedure);
    }
    printf("   %s",(long)(int)local_c * 0x30 + 0x11a404);
    putchar(10);
  }
  return;
}

Assistant:

void dumpsymboltable(void)
{
    int  i, j;
    
    printf("SYMBOL TABLE DUMP\n-----------------\n\n");
    printf("                   Token       Symbol     Data");
    printf("              Owning\n");
    printf("Index   Name       Class       Type       Type");
    printf("    Value   Procedure    Label\n");
    printf("-----   ----       -----       ------     ----");
    printf("    -----   ---------\n");
    
    for  (i = 0;  i < symtablen;  i++) {
        printf("%5d\t",i);
        printlexeme(i);
        if (nametable[symtab[i].thisname].strlength < 11)
            for (j = 0;
                 j < 11
                 - nametable[symtab[i].thisname].strlength;
                 j++)
                putchar(' ');
        else
            printf("\n          ");
        
        printf("%s  ",tokclstring[symtab[i].tok_class]);
        
        printf("%s  ", symtypestring[symtab[i].symtype]);
        
        printf("%s",  datatypestring[symtab[i].dataclass]);
        
        if (symtab[i].value.tag == tint)
            printf(" %5d", symtab[i].value.val.ival);
        else
            printf(" %8.3f", symtab[i].value.val.rval);
        
        if (symtab[i].owningprocedure == -1)
            printf("   global");
        else {
            printf("   ");
            LexemeInCaps(symtab[i].owningprocedure);
        }
        printf("   %s", symtab[i].label);
        putchar('\n');
    }
    
}